

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip39.c
# Opt level: O1

int bip39_mnemonic_from_bytes(words *w,uchar *bytes,size_t bytes_len,char **output)

{
  ulong uVar1;
  int iVar2;
  words *pwVar3;
  uchar tmp_bytes [42];
  sha256 sha;
  
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  if ((bytes_len != 0 && bytes != (uchar *)0x0) && output != (char **)0x0) {
    pwVar3 = &en_words;
    if (w != (words *)0x0) {
      pwVar3 = w;
    }
    if ((pwVar3->bits == 0xb) && (uVar1 = bytes_len - 0x10 >> 2, (bytes_len << 0x3e | uVar1) < 7)) {
      iVar2 = (*(code *)(&DAT_005a1550 + *(int *)(&DAT_005a1550 + uVar1 * 4)))();
      return iVar2;
    }
  }
  return -2;
}

Assistant:

int bip39_mnemonic_from_bytes(const struct words *w,
                              const unsigned char *bytes, size_t bytes_len,
                              char **output)
{
    unsigned char tmp_bytes[BIP39_ENTROPY_LEN_MAX];
    size_t checksum, mask;

    if (output)
        *output = NULL;

    if (!bytes || !bytes_len || !output)
        return WALLY_EINVAL;

    w = w ? w : &en_words;

    if (w->bits != 11u || !(mask = len_to_mask(bytes_len)))
        return WALLY_EINVAL;

    memcpy(tmp_bytes, bytes, bytes_len);
    checksum = bip39_checksum(bytes, bytes_len, mask);
    tmp_bytes[bytes_len] = checksum & 0xff;
    if (mask > 0xff)
        tmp_bytes[++bytes_len] = (checksum >> 8) & 0xff;
    *output = mnemonic_from_bytes(w, tmp_bytes, bytes_len + 1);
    wally_clear(tmp_bytes, sizeof(tmp_bytes));
    return *output ? WALLY_OK : WALLY_ENOMEM;
}